

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

JavascriptGenerator * __thiscall
Js::JavascriptLibrary::CreateGenerator
          (JavascriptLibrary *this,Arguments *args,ScriptFunction *scriptFunction,
          RecyclableObject *prototype)

{
  ScriptContext *scriptContext;
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicTypeHandler *typeHandler;
  DynamicType *generatorType;
  JavascriptGenerator *pJVar4;
  
  if (((((this->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->
      m_ES6Generators == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1847,"(scriptContext->GetConfig()->IsES6GeneratorsEnabled())",
                                "scriptContext->GetConfig()->IsES6GeneratorsEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  scriptContext = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  recycler = this->recycler;
  typeHandler = (DynamicTypeHandler *)NullTypeHandler<false>::GetDefaultInstance();
  generatorType =
       DynamicType::New(scriptContext,TypeIds_Generator,prototype,(JavascriptMethod)0x0,typeHandler,
                        false,false);
  pJVar4 = JavascriptGenerator::New(recycler,generatorType,args,scriptFunction);
  return pJVar4;
}

Assistant:

JavascriptGenerator* JavascriptLibrary::CreateGenerator(
        Arguments& args,
        ScriptFunction* scriptFunction,
        RecyclableObject* prototype)
    {
        Assert(scriptContext->GetConfig()->IsES6GeneratorsEnabled());
        return JavascriptGenerator::New(
            GetRecycler(),
            CreateGeneratorType(prototype),
            args,
            scriptFunction);
    }